

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::texstorage2d(NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ContextType ctxType;
  deUint32 textures [2];
  string local_38;
  GLuint local_18 [2];
  
  local_18[0] = 0x1234;
  local_18[1] = 0x1234;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,2,local_18);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,local_18[0]);
  NegativeTestContext::expectError(ctx,0);
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "GL_INVALID_ENUM or GL_INVALID_VALUE is generated if internalformat is not a valid sized internal format."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexStorage2D(&ctx->super_CallLogWrapper,0xde1,1,0,0x10,0x10);
  NegativeTestContext::expectError(ctx,0x500,0x501);
  glu::CallLogWrapper::glTexStorage2D(&ctx->super_CallLogWrapper,0xde1,1,0x8d99,0x10,0x10);
  NegativeTestContext::expectError(ctx,0x500,0x501);
  NegativeTestContext::endSection(ctx);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if target is not one of the accepted target enumerants.",
             "");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexStorage2D(&ctx->super_CallLogWrapper,0,1,0x8058,0x10,0x10);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexStorage2D(&ctx->super_CallLogWrapper,0x806f,1,0x8058,0x10,0x10);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexStorage2D(&ctx->super_CallLogWrapper,0x8c1a,1,0x8058,0x10,0x10);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"GL_INVALID_VALUE is generated if width or height are less than 1."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexStorage2D(&ctx->super_CallLogWrapper,0xde1,1,0x8058,0,0x10);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexStorage2D(&ctx->super_CallLogWrapper,0xde1,1,0x8058,0x10,0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexStorage2D(&ctx->super_CallLogWrapper,0xde1,1,0x8058,0,0);
  NegativeTestContext::expectError(ctx,0x501);
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (bVar2) {
    glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8513,local_18[1]);
    NegativeTestContext::expectError(ctx,0);
    glu::CallLogWrapper::glTexStorage2D(&ctx->super_CallLogWrapper,0x8513,1,0x8058,0,0x10);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glTexStorage2D(&ctx->super_CallLogWrapper,0x8513,1,0x8058,0x10,0);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glTexStorage2D(&ctx->super_CallLogWrapper,0x8513,1,0x8058,0,0);
    NegativeTestContext::expectError(ctx,0x501);
  }
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,2,local_18);
  return;
}

Assistant:

void texstorage2d (NegativeTestContext& ctx)
{
	deUint32  textures[] = {0x1234, 0x1234};

	ctx.glGenTextures(2, textures);
	ctx.glBindTexture(GL_TEXTURE_2D, textures[0]);
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_ENUM or GL_INVALID_VALUE is generated if internalformat is not a valid sized internal format.");
	ctx.glTexStorage2D(GL_TEXTURE_2D, 1, 0, 16, 16);
	ctx.expectError(GL_INVALID_ENUM, GL_INVALID_VALUE);
	ctx.glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA_INTEGER, 16, 16);
	ctx.expectError(GL_INVALID_ENUM, GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not one of the accepted target enumerants.");
	ctx.glTexStorage2D(0, 1, GL_RGBA8, 16, 16);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexStorage2D(GL_TEXTURE_3D, 1, GL_RGBA8, 16, 16);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexStorage2D(GL_TEXTURE_2D_ARRAY, 1, GL_RGBA8, 16, 16);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if width or height are less than 1.");
	ctx.glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 0, 16);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 16, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		ctx.glBindTexture(GL_TEXTURE_CUBE_MAP, textures[1]);
		ctx.expectError(GL_NO_ERROR);
		ctx.glTexStorage2D(GL_TEXTURE_CUBE_MAP, 1, GL_RGBA8, 0, 16);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.glTexStorage2D(GL_TEXTURE_CUBE_MAP, 1, GL_RGBA8, 16, 0);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.glTexStorage2D(GL_TEXTURE_CUBE_MAP, 1, GL_RGBA8, 0, 0);
		ctx.expectError(GL_INVALID_VALUE);
	}
	ctx.endSection();

	ctx.glDeleteTextures(2, textures);
}